

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericValidator::boundsCheck
          (AbstractNumericValidator *this,XMLNumber *theData,MemoryManager *manager)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  XMLNumber *pXVar4;
  InvalidDatatypeValueException *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int result;
  int thisFacetsDefined;
  MemoryManager *manager_local;
  XMLNumber *theData_local;
  AbstractNumericValidator *this_local;
  
  uVar1 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this);
  if (uVar1 != 0) {
    if ((uVar1 & 0x40) != 0) {
      pXVar4 = AbstractNumericFacetValidator::getMaxExclusive
                         (&this->super_AbstractNumericFacetValidator);
      iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                super_XSerializable._vptr_XSerializable[0x10])(this,theData,pXVar4);
      if (iVar2 != -1) {
        pIVar5 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(theData->super_XSerializable)._vptr_XSerializable[6])();
        pXVar4 = AbstractNumericFacetValidator::getMaxExclusive
                           (&this->super_AbstractNumericFacetValidator);
        iVar3 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericValidator.cpp"
                   ,0x50,VALUE_exceed_maxExcl,(XMLCh *)CONCAT44(extraout_var,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_00,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar5,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    if ((uVar1 & 0x20) != 0) {
      pXVar4 = AbstractNumericFacetValidator::getMaxInclusive
                         (&this->super_AbstractNumericFacetValidator);
      iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                super_XSerializable._vptr_XSerializable[0x10])(this,theData,pXVar4);
      if (iVar2 == 1) {
        pIVar5 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(theData->super_XSerializable)._vptr_XSerializable[6])();
        pXVar4 = AbstractNumericFacetValidator::getMaxInclusive
                           (&this->super_AbstractNumericFacetValidator);
        iVar3 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericValidator.cpp"
                   ,0x5d,VALUE_exceed_maxIncl,(XMLCh *)CONCAT44(extraout_var_01,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_02,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar5,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    if ((uVar1 & 0x80) != 0) {
      pXVar4 = AbstractNumericFacetValidator::getMinInclusive
                         (&this->super_AbstractNumericFacetValidator);
      iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                super_XSerializable._vptr_XSerializable[0x10])(this,theData,pXVar4);
      if (iVar2 == -1) {
        pIVar5 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(theData->super_XSerializable)._vptr_XSerializable[6])();
        pXVar4 = AbstractNumericFacetValidator::getMinInclusive
                           (&this->super_AbstractNumericFacetValidator);
        iVar3 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericValidator.cpp"
                   ,0x6a,VALUE_exceed_minIncl,(XMLCh *)CONCAT44(extraout_var_03,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_04,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar5,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    if ((uVar1 & 0x100) != 0) {
      pXVar4 = AbstractNumericFacetValidator::getMinExclusive
                         (&this->super_AbstractNumericFacetValidator);
      iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                super_XSerializable._vptr_XSerializable[0x10])(this,theData,pXVar4);
      if (iVar2 != 1) {
        pIVar5 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        iVar2 = (*(theData->super_XSerializable)._vptr_XSerializable[6])();
        pXVar4 = AbstractNumericFacetValidator::getMinExclusive
                           (&this->super_AbstractNumericFacetValidator);
        iVar3 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericValidator.cpp"
                   ,0x77,VALUE_exceed_minExcl,(XMLCh *)CONCAT44(extraout_var_05,iVar2),
                   (XMLCh *)CONCAT44(extraout_var_06,iVar3),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar5,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
  }
  return;
}

Assistant:

void AbstractNumericValidator::boundsCheck(const XMLNumber*         const theData
                                          ,      MemoryManager*     const manager)
{
    int thisFacetsDefined = getFacetsDefined();
    int result;

    if (thisFacetsDefined == 0)
        return;

    // must be < MaxExclusive
    if ( (thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0 )
    {
        result = compareValues(theData, getMaxExclusive());
        if ( result != -1)
        {
            REPORT_VALUE_ERROR(theData
                                 , getMaxExclusive()
                                 , XMLExcepts::VALUE_exceed_maxExcl
                                 , manager)
        }
    } 	

    // must be <= MaxInclusive
    if ( (thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0 )
    {
        result = compareValues(theData, getMaxInclusive());
        if (result == 1)
        {
            REPORT_VALUE_ERROR(theData
                             , getMaxInclusive()
                             , XMLExcepts::VALUE_exceed_maxIncl
                             , manager)
        }
    }

    // must be >= MinInclusive
    if ( (thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0 )
    {
        result = compareValues(theData, getMinInclusive());
        if (result == -1)
        {
            REPORT_VALUE_ERROR(theData
                             , getMinInclusive()
                             , XMLExcepts::VALUE_exceed_minIncl
                             , manager)
        }
    }

    // must be > MinExclusive
    if ( (thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0 )
    {
        result = compareValues(theData, getMinExclusive());
        if (result != 1)
        {
            REPORT_VALUE_ERROR(theData
                             , getMinExclusive()
                             , XMLExcepts::VALUE_exceed_minExcl
                             , manager)
        }
    }
}